

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O0

void Memory::HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
     ::DeleteHeapBlockList
               (SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *list,
               Recycler *recycler)

{
  Recycler *recycler_local;
  SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *list_local;
  
  HeapBlockList::
  ForEachEditing<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>,Memory::HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>>::DeleteHeapBlockList(Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>*,Memory::Recycler*)::_lambda(Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>*)_1_>
            (list,(anon_class_8_1_b8cf05bd)recycler);
  return;
}

Assistant:

void
HeapBucketT<TBlockType>::DeleteHeapBlockList(TBlockType * list, Recycler * recycler)
{
    HeapBlockList::ForEachEditing(list, [recycler](TBlockType * heapBlock)
    {
#if DBG
        heapBlock->ReleasePagesShutdown(recycler);
#endif
        TBlockType::Delete(heapBlock);
    });
}